

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_render.h
# Opt level: O0

void embree::renderBenchFunc<embree::Tutorial>
               (BenchState *state,BenchParams *params,int argc,char **argv)

{
  char **in_stack_00000888;
  int in_stack_00000894;
  BenchParams *in_stack_00000898;
  BenchState *in_stack_000008a0;
  
  renderBenchmarkLegacy<embree::Tutorial>
            (in_stack_000008a0,in_stack_00000898,in_stack_00000894,in_stack_00000888);
  return;
}

Assistant:

static void renderBenchFunc(BenchState& state, BenchParams& params ,int argc, char** argv)
{
#ifdef USE_GOOGLE_BENCHMARK
  if (params.legacy) {
    renderBenchmarkLegacy<Tutorial>(state, params, argc, argv);
    return;
  }

  Tutorial tutorial;
  tutorial.interactive = false;
  tutorial.main(argc,argv);

  tutorial.resize(tutorial.width, tutorial.height);
  ISPCCamera ispccamera = tutorial.camera.getISPCCamera(tutorial.width, tutorial.height);

  for (size_t i = 0; i < params.skipIterations; i++)
  {
    tutorial.initRayStats();
    tutorial.render(tutorial.pixels,tutorial.width,tutorial.height,0.0f,ispccamera);
  }

  size_t numRays = 0;
  for (auto _ : *state.state)
  {
    tutorial.initRayStats();
    tutorial.render(tutorial.pixels,tutorial.width,tutorial.height,0.0f,ispccamera);
    numRays += tutorial.getNumRays();
  }

  state.state->SetItemsProcessed(state.state->iterations());
  state.state->counters["Rays/s"] = benchmark::Counter(numRays, benchmark::Counter::kIsRate);
#else
  renderBenchmarkLegacy<Tutorial>(state, params, argc, argv);
#endif
}